

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player_const_2.h
# Opt level: O0

int __thiscall
PlayerConst_2::move(PlayerConst_2 *this,vector<Move,_std::allocator<Move>_> *moveHistory)

{
  int iVar1;
  long in_RDI;
  
  iVar1 = rand();
  if (iVar1 % 0x14 == 0) {
    iVar1 = rand();
    *(int *)(in_RDI + 0x28) = iVar1 % 3;
  }
  return *(int *)(in_RDI + 0x28);
}

Assistant:

int move(const std::vector<Move>& moveHistory)
   {
      // Every ten moves or so, it will change strategy.
      if ((rand()%20) == 0)
      {
         m_play = rand() % 3;
      }
      return m_play;
   }